

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_gc_mark_protected_WRAP(WorkerP *w,Task *__dq_head,TD_mtbdd_gc_mark_protected *t)

{
  MTBDD *pMVar1;
  long lVar2;
  uint64_t *puStack_30;
  
  lVar2 = 0;
  puStack_30 = protect_iter(&mtbdd_protected,0,mtbdd_protected.refs_size);
  while (puStack_30 != (uint64_t *)0x0) {
    pMVar1 = (MTBDD *)protect_next(&mtbdd_protected,&puStack_30,mtbdd_protected.refs_size);
    mtbdd_gc_mark_rec_SPAWN(w,__dq_head,*pMVar1);
    __dq_head = __dq_head + 1;
    lVar2 = lVar2 + -1;
  }
  for (; __dq_head = __dq_head + -1, lVar2 != 0; lVar2 = lVar2 + 1) {
    mtbdd_gc_mark_rec_SYNC(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&mtbdd_protected, 0, mtbdd_protected.refs_size);
    while (it != NULL) {
        BDD *to_mark = (BDD*)protect_next(&mtbdd_protected, &it, mtbdd_protected.refs_size);
        SPAWN(mtbdd_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}